

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerObjectGraphDumper.cpp
# Opt level: O0

void __thiscall
Memory::RecyclerObjectGraphDumper::DumpObjectReference
          (RecyclerObjectGraphDumper *this,void *objectAddress,bool remark)

{
  code *pcVar1;
  bool bVar2;
  CollectionState CVar3;
  undefined8 *in_FS_OFFSET;
  char16_t *local_30;
  bool remark_local;
  void *objectAddress_local;
  RecyclerObjectGraphDumper *this_local;
  
  if ((((this->param == (Param *)0x0) || ((this->param->dumpRootOnly & 1U) == 0)) ||
      (CVar3 = ObservableValue::operator_cast_to_CollectionState
                         ((ObservableValue *)&this->recycler->collectionState),
      CVar3 == CollectionStateFindRoots)) &&
     (((this->param == (Param *)0x0 ||
       (this->param->dumpReferenceFunc == (_func_bool_char16_ptr_void_ptr_void_ptr *)0x0)) ||
      (bVar2 = (*this->param->dumpReferenceFunc)
                         (this->dumpObjectName,this->dumpObject,objectAddress), bVar2)))) {
    Output::Print(L"\"");
    if (this->dumpObjectName == (char16 *)0x0) {
      if (this->dumpObject == (void *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerObjectGraphDumper.cpp"
                           ,0x5a,"(this->dumpObject != nullptr)","this->dumpObject != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      RecyclerObjectDumper::DumpObject
                (this->dumpObjectTypeInfo,(bool)(this->dumpObjectIsArray & 1),this->dumpObject);
    }
    else {
      Output::Print(L"%s",this->dumpObjectName);
    }
    if (remark) {
      local_30 = L"\" => \"";
    }
    else {
      local_30 = L"\" -> \"";
    }
    Output::Print(local_30);
    Recycler::DumpObjectDescription(this->recycler,objectAddress);
    Output::Print(L"\"\n");
  }
  return;
}

Assistant:

void RecyclerObjectGraphDumper::DumpObjectReference(void * objectAddress, bool remark)
{
    if (this->param == nullptr || !this->param->dumpRootOnly || recycler->collectionState == CollectionStateFindRoots)
    {
        if (this->param != nullptr && this->param->dumpReferenceFunc)
        {
            if (!this->param->dumpReferenceFunc(this->dumpObjectName, this->dumpObject, objectAddress))
                return;
        }
        Output::Print(_u("\""));
        if (this->dumpObjectName)
        {
            Output::Print(_u("%s"), this->dumpObjectName);
        }
        else
        {
            Assert(this->dumpObject != nullptr);
#ifdef PROFILE_RECYCLER_ALLOC
            RecyclerObjectDumper::DumpObject(this->dumpObjectTypeInfo, this->dumpObjectIsArray, this->dumpObject);
#else
            Output::Print(_u("Address %p"), objectAddress);
#endif
        }

        Output::Print(remark? _u("\" => \"") : _u("\" -> \""));
        recycler->DumpObjectDescription(objectAddress);

        Output::Print(_u("\"\n"));
    }
}